

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  uint uVar1;
  SPIRFunction *meta_00;
  InterfaceBlockMeta *var_00;
  SPIRVariable *ib_type_00;
  SPIRType *ib_var_ref_00;
  StorageClass storage_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  ExecutionModel EVar6;
  TypedID<(spirv_cross::Types)2> TVar7;
  SPIRType *pSVar8;
  CompilerError *pCVar9;
  size_t sVar10;
  TypedID *pTVar11;
  TypedID<(spirv_cross::Types)1> *pTVar12;
  bool local_491;
  byte local_3eb;
  bool local_3ea;
  bool local_3e9;
  SPIRType *local_3e0;
  bool attribute_load_store_1;
  bool storage_is_stage_io_1;
  bool is_composite_type_1;
  string local_3c0 [32];
  ID local_3a0;
  allocator local_399;
  string local_398 [32];
  ID local_378;
  uint32_t local_374;
  string local_370 [32];
  TypeID local_350;
  uint local_34c;
  undefined1 auStack_348 [4];
  uint32_t mbr_idx_1;
  __buckets_ptr pp_Stack_340;
  size_type local_338;
  __node_base _Stack_330;
  size_type local_328;
  _Prime_rehash_policy _Stack_320;
  __node_base_ptr p_Stack_310;
  spirv_cross local_300 [32];
  spirv_cross local_2e0 [32];
  string local_2c0 [8];
  string var_chain_qual;
  string local_2a0 [8];
  string mbr_name_qual;
  string local_280 [8];
  string var_name;
  ID local_25c;
  string local_258;
  bool storage_is_stage_io;
  bool attribute_load_store;
  bool is_composite_type;
  ID local_234;
  VariableID local_230;
  StorageClass local_22c;
  SPIRConstant *local_228;
  SPIRConstant *c;
  undefined1 local_218 [4];
  uint32_t initializer;
  SPIRType ptr_type;
  uint32_t local_b0;
  uint32_t var_id;
  uint32_t ptr_type_id;
  uint32_t ids;
  SPIRType *mbr_type;
  uint local_98;
  uint32_t mbr_idx;
  uint32_t elem_idx;
  uint32_t elem_cnt;
  uint32_t var_mbr_idx;
  uint32_t location;
  bool masked_block;
  bool needs_local_declaration;
  bool block_requires_flattening;
  uint32_t local_74;
  uint32_t local_70;
  uint32_t local_6c;
  uint32_t local_68;
  uint32_t locn;
  byte local_5d;
  uint32_t local_5c;
  BuiltIn BStack_58;
  bool is_block;
  byte local_51;
  BuiltIn builtin;
  bool is_builtin;
  SPIRType *var_type;
  SPIRFunction *entry_func;
  InterfaceBlockMeta *meta_local;
  SPIRVariable *var_local;
  SPIRType *ib_type_local;
  string *ib_var_ref_local;
  CompilerMSL *pCStack_18;
  StorageClass storage_local;
  CompilerMSL *this_local;
  
  entry_func = (SPIRFunction *)meta;
  meta_local = (InterfaceBlockMeta *)var;
  var_local = (SPIRVariable *)ib_type;
  ib_type_local = (SPIRType *)ib_var_ref;
  ib_var_ref_local._4_4_ = storage;
  pCStack_18 = this;
  uVar5 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  var_type = (SPIRType *)Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,uVar5);
  if (((entry_func->arguments).stack_storage.aligned_char[8] & 1U) == 0) {
    local_3e0 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)meta_local);
  }
  else {
    local_3e0 = Compiler::get_variable_element_type((Compiler *)this,(SPIRVariable *)meta_local);
  }
  _builtin = local_3e0;
  local_51 = Compiler::is_builtin_variable((Compiler *)this,(SPIRVariable *)meta_local);
  local_5c = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  BStack_58 = Compiler::get_decoration((Compiler *)this,(ID)local_5c,DecorationBuiltIn);
  locn = (_builtin->super_IVariant).self.id;
  local_5d = Compiler::has_decoration((Compiler *)this,(ID)locn,DecorationBlock);
  if ((ib_var_ref_local._4_4_ == StorageClassOutput) &&
     (bVar2 = CompilerGLSL::is_stage_output_variable_masked
                        (&this->super_CompilerGLSL,(SPIRVariable *)meta_local), bVar2)) {
    emit_local_masked_variable
              (this,(SPIRVariable *)meta_local,
               (bool)((entry_func->arguments).stack_storage.aligned_char[8] & 1));
  }
  else {
    if (((ib_var_ref_local._4_4_ == StorageClassInput) && (_builtin->basetype == Struct)) &&
       (((bVar2 = is_tesc_shader(this), bVar2 &&
         (((this->msl_options).multi_patch_workgroup & 1U) != 0)) ||
        ((bVar2 = is_tese_shader(this), bVar2 &&
         (((this->msl_options).raw_buffer_tese_input & 1U) != 0)))))) {
      local_68 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
      bVar2 = Compiler::has_decoration((Compiler *)this,(ID)local_68,DecorationLocation);
      if (bVar2) {
        local_70 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
        local_6c = Compiler::get_decoration((Compiler *)this,(ID)local_70,DecorationLocation);
        pSVar8 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)meta_local);
        ensure_struct_members_valid_vecsizes(this,pSVar8,&local_6c);
      }
    }
    if (ib_var_ref_local._4_4_ == StorageClassInput) {
      local_74 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
      bVar2 = Compiler::has_decoration((Compiler *)this,(ID)local_74,DecorationPerVertexKHR);
      if (bVar2) {
        pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar9,"PerVertexKHR decoration is not supported in MSL.");
        __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
    }
    uVar5 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
    CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar5);
    if (_builtin->basetype == Struct) {
      bVar2 = variable_storage_requires_stage_io(this,ib_var_ref_local._4_4_);
      local_3e9 = true;
      if (!bVar2) {
        local_3ea = false;
        if ((local_5d & 1) != 0) {
          local_3ea = VectorView<unsigned_int>::empty
                                (&(_builtin->array).super_VectorView<unsigned_int>);
        }
        local_3e9 = local_3ea;
      }
      var_mbr_idx._3_1_ = local_3e9;
      local_3eb = 0;
      if (((local_51 & 1) == 0) && (local_3eb = 0, local_3e9 != false)) {
        local_3eb = (entry_func->arguments).stack_storage.aligned_char[9];
      }
      var_mbr_idx._2_1_ = local_3eb & 1;
      if (var_mbr_idx._2_1_ != 0) {
        emit_local_masked_variable
                  (this,(SPIRVariable *)meta_local,
                   (bool)((entry_func->arguments).stack_storage.aligned_char[8] & 1));
      }
      if ((var_mbr_idx._3_1_ & 1) == 0) {
        add_plain_variable_to_interface_block
                  (this,ib_var_ref_local._4_4_,(string *)ib_type_local,(SPIRType *)var_local,
                   (SPIRVariable *)meta_local,(InterfaceBlockMeta *)entry_func);
      }
      else {
        var_mbr_idx._1_1_ = 0;
        elem_cnt = 0xffffffff;
        elem_idx = 0;
        mbr_idx = 1;
        bVar2 = Compiler::is_matrix((Compiler *)this,_builtin);
        if (bVar2) {
          bVar2 = Compiler::is_array((Compiler *)this,_builtin);
          if (bVar2) {
            pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar9,"MSL cannot emit arrays-of-matrices in input and output variables.");
            __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          mbr_idx = _builtin->columns;
        }
        else {
          bVar2 = Compiler::is_array((Compiler *)this,_builtin);
          if (bVar2) {
            sVar10 = VectorView<unsigned_int>::size
                               (&(_builtin->array).super_VectorView<unsigned_int>);
            if (sVar10 != 1) {
              pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (pCVar9,"MSL cannot emit arrays-of-arrays in input and output variables.");
              __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            mbr_idx = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,_builtin);
          }
        }
        for (local_98 = 0; local_98 < mbr_idx; local_98 = local_98 + 1) {
          for (mbr_type._4_4_ = 0; uVar1 = mbr_type._4_4_,
              sVar10 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                                 (&(_builtin->member_types).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
              uVar1 < (uint)sVar10; mbr_type._4_4_ = mbr_type._4_4_ + 1) {
            BStack_58 = BuiltInMax;
            local_51 = Compiler::is_member_builtin
                                 ((Compiler *)this,_builtin,mbr_type._4_4_,&stack0xffffffffffffffa8)
            ;
            pTVar11 = (TypedID *)
                      VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                                (&(_builtin->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                                 (ulong)mbr_type._4_4_);
            uVar5 = TypedID::operator_cast_to_unsigned_int(pTVar11);
            _ptr_type_id = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar5);
            if ((ib_var_ref_local._4_4_ == StorageClassOutput) &&
               (bVar2 = CompilerGLSL::is_stage_output_block_member_masked
                                  (&this->super_CompilerGLSL,(SPIRVariable *)meta_local,
                                   mbr_type._4_4_,
                                   (bool)((entry_func->arguments).stack_storage.aligned_char[8] & 1)
                                  ), bVar2)) {
              elem_cnt = 0xffffffff;
              if ((local_5d & 1) != 0) {
                var_mbr_idx._1_1_ = 1;
              }
              if (((local_51 & 1) != 0) &&
                 (((entry_func->arguments).stack_storage.aligned_char[8] & 1U) == 0)) {
                local_b0 = ParsedIR::increase_bound_by
                                     (&(this->super_CompilerGLSL).super_Compiler.ir,2);
                ptr_type.member_name_cache._M_h._M_single_bucket._4_4_ = local_b0 + 1;
                var_id = local_b0;
                SPIRType::SPIRType((SPIRType *)local_218,_ptr_type_id);
                ptr_type.array_size_literal.stack_storage.aligned_char[4] = '\x01';
                ptr_type.array_size_literal.stack_storage.aligned_char._0_4_ =
                     ptr_type.array_size_literal.stack_storage.aligned_char._0_4_ + 1;
                pTVar12 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                                    (&(_builtin->member_types).
                                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                     ,(ulong)mbr_type._4_4_);
                ptr_type.image.access = pTVar12->id;
                ptr_type.cooperative.columns_id = 3;
                c._4_4_ = 0;
                uVar5 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(meta_local->location_meta)._M_h._M_element_count);
                if (uVar5 != 0) {
                  uVar5 = TypedID::operator_cast_to_unsigned_int
                                    ((TypedID *)&(meta_local->location_meta)._M_h._M_element_count);
                  local_228 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,uVar5)
                  ;
                  if (local_228 != (SPIRConstant *)0x0) {
                    pTVar11 = (TypedID *)
                              VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::operator[]
                                        (&(local_228->subconstants).
                                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>
                                         ,(ulong)mbr_type._4_4_);
                    c._4_4_ = TypedID::operator_cast_to_unsigned_int(pTVar11);
                  }
                }
                Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                          ((Compiler *)this,local_b0,(SPIRType *)local_218);
                local_22c = StorageClassOutput;
                Compiler::
                set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,unsigned_int&>
                          ((Compiler *)this,ptr_type.member_name_cache._M_h._M_single_bucket._4_4_,
                           &local_b0,&local_22c,(uint *)((long)&c + 4));
                pSVar8 = var_type;
                TypedID<(spirv_cross::Types)2>::TypedID
                          (&local_230,ptr_type.member_name_cache._M_h._M_single_bucket._4_4_);
                SPIRFunction::add_local_variable((SPIRFunction *)pSVar8,local_230);
                SmallVector<unsigned_int,_8UL>::push_back
                          (&this->vars_needing_early_declaration,
                           (uint *)((long)&ptr_type.member_name_cache._M_h._M_single_bucket + 4));
                TypedID<(spirv_cross::Types)0>::TypedID
                          (&local_234,ptr_type.member_name_cache._M_h._M_single_bucket._4_4_);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                          (&local_258,this,(ulong)BStack_58,3);
                Compiler::set_name((Compiler *)this,local_234,&local_258);
                ::std::__cxx11::string::~string((string *)&local_258);
                TypedID<(spirv_cross::Types)0>::TypedID
                          (&local_25c,ptr_type.member_name_cache._M_h._M_single_bucket._4_4_);
                Compiler::set_decoration((Compiler *)this,local_25c,DecorationBuiltIn,BStack_58);
                SPIRType::~SPIRType((SPIRType *)local_218);
              }
            }
            else if (((local_51 & 1) == 0) ||
                    (bVar2 = Compiler::has_active_builtin
                                       ((Compiler *)this,BStack_58,ib_var_ref_local._4_4_), bVar2))
            {
              bVar3 = Compiler::is_matrix((Compiler *)this,_ptr_type_id);
              bVar2 = true;
              if (!bVar3) {
                bVar3 = Compiler::is_array((Compiler *)this,_ptr_type_id);
                bVar2 = true;
                if (!bVar3) {
                  bVar2 = _ptr_type_id->basetype == Struct;
                }
              }
              bVar3 = false;
              if (ib_var_ref_local._4_4_ == StorageClassInput) {
                EVar6 = Compiler::get_execution_model((Compiler *)this);
                bVar3 = EVar6 != ExecutionModelFragment;
              }
              bVar4 = variable_storage_requires_stage_io(this,ib_var_ref_local._4_4_);
              if ((BStack_58 == BuiltInClipDistance) || (BStack_58 == BuiltInCullDistance)) {
                local_51 = 0;
              }
              uVar5 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (local_280,this,(ulong)uVar5,1);
              ::std::__cxx11::string::string(local_2a0,local_280);
              ::std::__cxx11::string::string(local_2c0,local_280);
              if (1 < mbr_idx) {
                join<char_const(&)[2],unsigned_int&>(local_2e0,(char (*) [2])0x40fecd,&local_98);
                ::std::__cxx11::string::operator+=(local_2a0,(string *)local_2e0);
                ::std::__cxx11::string::~string((string *)local_2e0);
                join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                          (local_300,(char (*) [2])0x40f992,&local_98,(char (*) [2])0x40f897);
                ::std::__cxx11::string::operator+=(local_2c0,(string *)local_300);
                ::std::__cxx11::string::~string((string *)local_300);
              }
              storage_00 = ib_var_ref_local._4_4_;
              ib_var_ref_00 = ib_type_local;
              ib_type_00 = var_local;
              var_00 = meta_local;
              meta_00 = entry_func;
              pSVar8 = _builtin;
              uVar5 = mbr_type._4_4_;
              if (((((local_51 & 1) == 0) || (bVar3)) && (bVar4)) && (bVar2)) {
                _Stack_320._M_next_resize = 0;
                p_Stack_310 = (__node_base_ptr)0x0;
                local_328 = 0;
                _Stack_320._M_max_load_factor = 0.0;
                _Stack_320._4_4_ = 0;
                local_338 = 0;
                _Stack_330._M_nxt = (_Hash_node_base *)0x0;
                _auStack_348 = 0;
                pp_Stack_340 = (__buckets_ptr)0x0;
                Bitset::Bitset((Bitset *)auStack_348);
                add_composite_member_variable_to_interface_block
                          (this,storage_00,(string *)ib_var_ref_00,(SPIRType *)ib_type_00,
                           (SPIRVariable *)var_00,pSVar8,uVar5,(InterfaceBlockMeta *)meta_00,
                           (string *)local_2a0,(string *)local_2c0,&elem_cnt,&elem_idx,
                           (Bitset *)auStack_348);
                Bitset::~Bitset((Bitset *)auStack_348);
              }
              else {
                add_plain_member_variable_to_interface_block
                          (this,ib_var_ref_local._4_4_,(string *)ib_type_local,(SPIRType *)var_local
                           ,(SPIRVariable *)meta_local,_builtin,mbr_type._4_4_,
                           (InterfaceBlockMeta *)entry_func,(string *)local_2a0,(string *)local_2c0,
                           &elem_cnt,&elem_idx);
              }
              ::std::__cxx11::string::~string(local_2c0);
              ::std::__cxx11::string::~string(local_2a0);
              ::std::__cxx11::string::~string(local_280);
            }
            elem_idx = elem_idx + 1;
          }
        }
        if ((((var_mbr_idx._1_1_ & 1) != 0) && ((var_mbr_idx._2_1_ & 1) == 0)) &&
           ((bVar2 = Compiler::is_builtin_variable((Compiler *)this,(SPIRVariable *)meta_local),
            !bVar2 || (bVar2 = is_tesc_shader(this), bVar2)))) {
          bVar2 = Compiler::is_builtin_variable((Compiler *)this,(SPIRVariable *)meta_local);
          if (bVar2) {
            for (local_34c = 0; uVar1 = local_34c,
                sVar10 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                                   (&(_builtin->member_types).
                                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>)
                , uVar1 < (uint)sVar10; local_34c = local_34c + 1) {
              local_350.id = (uint32_t)
                             TypedID::operator_cast_to_TypedID
                                       ((TypedID *)&(_builtin->super_IVariant).self);
              uVar1 = local_34c;
              local_374 = (uint32_t)
                          TypedID::operator_cast_to_TypedID
                                    ((TypedID *)&(_builtin->super_IVariant).self);
              uVar5 = Compiler::get_member_decoration
                                ((Compiler *)this,(TypeID)local_374,local_34c,DecorationBuiltIn);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                        (local_370,this,(ulong)uVar5,3);
              Compiler::set_member_name((Compiler *)this,local_350,uVar1,local_370);
              ::std::__cxx11::string::~string((string *)local_370);
            }
            local_378.id = (_builtin->super_IVariant).self.id;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_398,"gl_PerVertex",&local_399);
            Compiler::set_name((Compiler *)this,local_378,(string *)local_398);
            ::std::__cxx11::string::~string(local_398);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_399);
            local_3a0.id = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_3c0,"gl_out_masked",(allocator *)&is_composite_type_1);
            Compiler::set_name((Compiler *)this,local_3a0,(string *)local_3c0);
            ::std::__cxx11::string::~string(local_3c0);
            ::std::allocator<char>::~allocator((allocator<char> *)&is_composite_type_1);
            TVar7 = TypedID::operator_cast_to_TypedID((TypedID *)&(_builtin->super_IVariant).self);
            (this->stage_out_masked_builtin_type_id).id = TVar7.id;
          }
          emit_local_masked_variable
                    (this,(SPIRVariable *)meta_local,
                     (bool)((entry_func->arguments).stack_storage.aligned_char[8] & 1));
        }
      }
    }
    else {
      bVar2 = is_tese_shader(this);
      if ((((bVar2) && (ib_var_ref_local._4_4_ == StorageClassInput)) &&
          (((entry_func->arguments).stack_storage.aligned_char[8] & 1U) == 0)) &&
         (((local_51 & 1) != 0 &&
          ((BStack_58 == BuiltInTessLevelOuter || (BStack_58 == BuiltInTessLevelInner)))))) {
        add_tess_level_input_to_interface_block
                  (this,(string *)ib_type_local,(SPIRType *)var_local,(SPIRVariable *)meta_local);
      }
      else if ((((_builtin->basetype == Boolean) || (_builtin->basetype == Char)) ||
               ((bVar2 = type_is_integral(_builtin), bVar2 ||
                (bVar2 = type_is_floating_point(_builtin), bVar2)))) &&
              (((local_51 & 1) == 0 ||
               (bVar2 = Compiler::has_active_builtin
                                  ((Compiler *)this,BStack_58,ib_var_ref_local._4_4_), bVar2)))) {
        bVar2 = Compiler::is_matrix((Compiler *)this,_builtin);
        local_491 = true;
        if (!bVar2) {
          local_491 = Compiler::is_array((Compiler *)this,_builtin);
        }
        bVar3 = variable_storage_requires_stage_io(this,ib_var_ref_local._4_4_);
        bVar2 = false;
        if (ib_var_ref_local._4_4_ == StorageClassInput) {
          EVar6 = Compiler::get_execution_model((Compiler *)this);
          bVar2 = EVar6 != ExecutionModelFragment;
        }
        if ((BStack_58 == BuiltInClipDistance) || (BStack_58 == BuiltInCullDistance)) {
          local_51 = 0;
        }
        if (((((local_51 & 1) == 0) || (bVar2)) && (bVar3)) && (local_491 != false)) {
          add_composite_variable_to_interface_block
                    (this,ib_var_ref_local._4_4_,(string *)ib_type_local,(SPIRType *)var_local,
                     (SPIRVariable *)meta_local,(InterfaceBlockMeta *)entry_func);
        }
        else {
          add_plain_variable_to_interface_block
                    (this,ib_var_ref_local._4_4_,(string *)ib_type_local,(SPIRType *)var_local,
                     (SPIRVariable *)meta_local,(InterfaceBlockMeta *)entry_func);
        }
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::add_variable_to_interface_block(StorageClass storage, const string &ib_var_ref, SPIRType &ib_type,
                                                  SPIRVariable &var, InterfaceBlockMeta &meta)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	// Tessellation control I/O variables and tessellation evaluation per-point inputs are
	// usually declared as arrays. In these cases, we want to add the element type to the
	// interface block, since in Metal it's the interface block itself which is arrayed.
	auto &var_type = meta.strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	bool is_builtin = is_builtin_variable(var);
	auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_block = has_decoration(var_type.self, DecorationBlock);

	// If stage variables are masked out, emit them as plain variables instead.
	// For builtins, we query them one by one later.
	// IO blocks are not masked here, we need to mask them per-member instead.
	if (storage == StorageClassOutput && is_stage_output_variable_masked(var))
	{
		// If we ignore an output, we must still emit it, since it might be used by app.
		// Instead, just emit it as early declaration.
		emit_local_masked_variable(var, meta.strip_array);
		return;
	}

	// Tesselation stages pass I/O via buffer content which may contain nested structs.
	// Ensure the vector sizes of any nested struct members within these input variables match
	// the vector sizes of the corresponding output variables from the previous pipeline stage.
	// This adjustment is handled here instead of ensure_correct_input_type() in order to
	// perform the necessary recursive processing.
	if (storage == StorageClassInput && var_type.basetype == SPIRType::Struct &&
		((is_tesc_shader() && msl_options.multi_patch_workgroup) ||
		 (is_tese_shader() && msl_options.raw_buffer_tese_input)) &&
		has_decoration(var.self, DecorationLocation))
	{
		uint32_t locn = get_decoration(var.self, DecorationLocation);
		ensure_struct_members_valid_vecsizes(get_variable_data_type(var), locn);
	}

	if (storage == StorageClassInput && has_decoration(var.self, DecorationPerVertexKHR))
		SPIRV_CROSS_THROW("PerVertexKHR decoration is not supported in MSL.");

	// If variable names alias, they will end up with wrong names in the interface struct, because
	// there might be aliases in the member name cache and there would be a mismatch in fixup_in code.
	// Make sure to register the variables as unique resource names ahead of time.
	// This would normally conflict with the name cache when emitting local variables,
	// but this happens in the setup stage, before we hit compilation loops.
	// The name cache is cleared before we actually emit code, so this is safe.
	add_resource_name(var.self);

	if (var_type.basetype == SPIRType::Struct)
	{
		bool block_requires_flattening =
		    variable_storage_requires_stage_io(storage) || (is_block && var_type.array.empty());
		bool needs_local_declaration = !is_builtin && block_requires_flattening && meta.allow_local_declaration;

		if (needs_local_declaration)
		{
			// For I/O blocks or structs, we will need to pass the block itself around
			// to functions if they are used globally in leaf functions.
			// Rather than passing down member by member,
			// we unflatten I/O blocks while running the shader,
			// and pass the actual struct type down to leaf functions.
			// We then unflatten inputs, and flatten outputs in the "fixup" stages.
			emit_local_masked_variable(var, meta.strip_array);
		}

		if (!block_requires_flattening)
		{
			// In Metal tessellation shaders, the interface block itself is arrayed. This makes things
			// very complicated, since stage-in structures in MSL don't support nested structures.
			// Luckily, for stage-out when capturing output, we can avoid this and just add
			// composite members directly, because the stage-out structure is stored to a buffer,
			// not returned.
			add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
		}
		else
		{
			bool masked_block = false;
			uint32_t location = UINT32_MAX;
			uint32_t var_mbr_idx = 0;
			uint32_t elem_cnt = 1;
			if (is_matrix(var_type))
			{
				if (is_array(var_type))
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

				elem_cnt = var_type.columns;
			}
			else if (is_array(var_type))
			{
				if (var_type.array.size() != 1)
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

				elem_cnt = to_array_size_literal(var_type);
			}

			for (uint32_t elem_idx = 0; elem_idx < elem_cnt; elem_idx++)
			{
				// Flatten the struct members into the interface struct
				for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
				{
					builtin = BuiltInMax;
					is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
					auto &mbr_type = get<SPIRType>(var_type.member_types[mbr_idx]);

					if (storage == StorageClassOutput && is_stage_output_block_member_masked(var, mbr_idx, meta.strip_array))
					{
						location = UINT32_MAX; // Skip this member and resolve location again on next var member

						if (is_block)
							masked_block = true;

						// Non-builtin block output variables are just ignored, since they will still access
						// the block variable as-is. They're just not flattened.
						if (is_builtin && !meta.strip_array)
						{
							// Emit a fake variable instead.
							uint32_t ids = ir.increase_bound_by(2);
							uint32_t ptr_type_id = ids + 0;
							uint32_t var_id = ids + 1;

							auto ptr_type = mbr_type;
							ptr_type.pointer = true;
							ptr_type.pointer_depth++;
							ptr_type.parent_type = var_type.member_types[mbr_idx];
							ptr_type.storage = StorageClassOutput;

							uint32_t initializer = 0;
							if (var.initializer)
								if (auto *c = maybe_get<SPIRConstant>(var.initializer))
									initializer = c->subconstants[mbr_idx];

							set<SPIRType>(ptr_type_id, ptr_type);
							set<SPIRVariable>(var_id, ptr_type_id, StorageClassOutput, initializer);
							entry_func.add_local_variable(var_id);
							vars_needing_early_declaration.push_back(var_id);
							set_name(var_id, builtin_to_glsl(builtin, StorageClassOutput));
							set_decoration(var_id, DecorationBuiltIn, builtin);
						}
					}
					else if (!is_builtin || has_active_builtin(builtin, storage))
					{
						bool is_composite_type = is_matrix(mbr_type) || is_array(mbr_type) || mbr_type.basetype == SPIRType::Struct;
						bool attribute_load_store =
								storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;
						bool storage_is_stage_io = variable_storage_requires_stage_io(storage);

						// Clip/CullDistance always need to be declared as user attributes.
						if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
							is_builtin = false;

						const string var_name = to_name(var.self);
						string mbr_name_qual = var_name;
						string var_chain_qual = var_name;
						if (elem_cnt > 1)
						{
							mbr_name_qual += join("_", elem_idx);
							var_chain_qual += join("[", elem_idx, "]");
						}

						if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
						{
							add_composite_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                                 var, var_type, mbr_idx, meta,
							                                                 mbr_name_qual, var_chain_qual,
							                                                 location, var_mbr_idx, {});
						}
						else
						{
							add_plain_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                             var, var_type, mbr_idx, meta,
							                                             mbr_name_qual, var_chain_qual,
							                                             location, var_mbr_idx);
						}
					}
					var_mbr_idx++;
				}
			}

			// If we're redirecting a block, we might still need to access the original block
			// variable if we're masking some members.
			if (masked_block && !needs_local_declaration && (!is_builtin_variable(var) || is_tesc_shader()))
			{
				if (is_builtin_variable(var))
				{
					// Ensure correct names for the block members if we're actually going to
					// declare gl_PerVertex.
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
					{
						set_member_name(var_type.self, mbr_idx, builtin_to_glsl(
								BuiltIn(get_member_decoration(var_type.self, mbr_idx, DecorationBuiltIn)),
								StorageClassOutput));
					}

					set_name(var_type.self, "gl_PerVertex");
					set_name(var.self, "gl_out_masked");
					stage_out_masked_builtin_type_id = var_type.self;
				}
				emit_local_masked_variable(var, meta.strip_array);
			}
		}
	}
	else if (is_tese_shader() && storage == StorageClassInput && !meta.strip_array && is_builtin &&
	         (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner))
	{
		add_tess_level_input_to_interface_block(ib_var_ref, ib_type, var);
	}
	else if (var_type.basetype == SPIRType::Boolean || var_type.basetype == SPIRType::Char ||
	         type_is_integral(var_type) || type_is_floating_point(var_type))
	{
		if (!is_builtin || has_active_builtin(builtin, storage))
		{
			bool is_composite_type = is_matrix(var_type) || is_array(var_type);
			bool storage_is_stage_io = variable_storage_requires_stage_io(storage);
			bool attribute_load_store = storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;

			// Clip/CullDistance always needs to be declared as user attributes.
			if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
				is_builtin = false;

			// MSL does not allow matrices or arrays in input or output variables, so need to handle it specially.
			if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
			{
				add_composite_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
			else
			{
				add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
		}
	}
}